

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O1

void setpath(lua_State *L,char *fieldname,char *envname1,char *envname2,char *def)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = getenv(envname1);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = getenv(envname2);
  }
  if (pcVar2 != (char *)0x0) {
    lua_getfield(L,-0xf4628,"LUA_NOENV");
    iVar1 = lua_toboolean(L,-1);
    lua_settop(L,-2);
    if (iVar1 == 0) {
      pcVar2 = luaL_gsub(L,pcVar2,";;",";\x01;");
      luaL_gsub(L,pcVar2,"\x01",def);
      lua_remove(L,-2);
      goto LAB_0011b66b;
    }
  }
  lua_pushstring(L,def);
LAB_0011b66b:
  lua_setfield(L,-2,fieldname);
  return;
}

Assistant:

static void setpath (lua_State *L, const char *fieldname, const char *envname1,
                                   const char *envname2, const char *def) {
  const char *path = getenv(envname1);
  if (path == NULL)  /* no environment variable? */
    path = getenv(envname2);  /* try alternative name */
  if (path == NULL || noenv(L))  /* no environment variable? */
    lua_pushstring(L, def);  /* use default */
  else {
    /* replace ";;" by ";AUXMARK;" and then AUXMARK by default path */
    path = luaL_gsub(L, path, LUA_PATH_SEP LUA_PATH_SEP,
                              LUA_PATH_SEP AUXMARK LUA_PATH_SEP);
    luaL_gsub(L, path, AUXMARK, def);
    lua_remove(L, -2);
  }
  setprogdir(L);
  lua_setfield(L, -2, fieldname);
}